

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_usage.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  App *pAVar2;
  Option *pOVar3;
  ParseError *e;
  string local_b20;
  allocator local_af9;
  string local_af8;
  allocator local_ad1;
  string local_ad0;
  allocator local_aa9;
  string local_aa8;
  string local_a88;
  allocator local_a61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  undefined1 local_a20 [8];
  string usage_msg;
  string local_9f8;
  allocator local_9d1;
  string local_9d0;
  allocator local_9a9;
  string local_9a8;
  allocator local_981;
  string local_980;
  Validator local_960;
  allocator local_8f1;
  string local_8f0;
  allocator local_8c9;
  string local_8c8;
  allocator local_8a1;
  string local_8a0;
  allocator local_879;
  string local_878;
  allocator local_851;
  string local_850;
  App *local_830;
  App *decode;
  string local_820;
  allocator local_7f9;
  string local_7f8;
  allocator local_7d1;
  string local_7d0;
  allocator local_7a9;
  string local_7a8;
  int local_788;
  allocator local_781;
  string local_780;
  string local_760;
  Validator local_740;
  Validator local_6d8;
  allocator local_669;
  string local_668;
  allocator local_641;
  string local_640;
  allocator local_619;
  string local_618;
  allocator local_5f1;
  string local_5f0;
  allocator local_5c9;
  string local_5c8;
  allocator local_5a1;
  string local_5a0;
  allocator local_579;
  string local_578;
  Validator local_558;
  allocator local_4e9;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  allocator local_449;
  string local_448;
  App *local_428;
  App *encode;
  string local_418;
  allocator local_3e1;
  string local_3e0;
  undefined1 local_3c0 [8];
  App app;
  int subopt;
  int level;
  string output_file_name;
  string input_file_name;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(output_file_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&subopt);
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 5;
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e0,"CLI11 help",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"",(allocator *)((long)&encode + 7));
  CLI::App::App((App *)local_3c0,&local_3e0,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)((long)&encode + 7));
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  CLI::App::require_subcommand((App *)local_3c0,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,"e",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_470,"encode",&local_471);
  pAVar2 = CLI::App::add_subcommand((App *)local_3c0,&local_448,&local_470);
  pAVar2 = CLI::App::ignore_case(pAVar2,true);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  local_428 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_498,"input",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c0,"input file",&local_4c1);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar2,&local_498,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&output_file_name.field_2 + 8),&local_4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8," ",&local_4e9);
  pOVar3 = CLI::Option::option_text(pOVar3,&local_4e8);
  pOVar3 = CLI::OptionBase<CLI::Option>::required(&pOVar3->super_OptionBase<CLI::Option>,true);
  CLI::Validator::Validator(&local_558,(Validator *)CLI::ExistingFile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_578,"",&local_579);
  CLI::Option::check(pOVar3,&local_558,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  CLI::Validator::~Validator(&local_558);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  pAVar2 = local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a0,"output",&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c8,"output file",&local_5c9);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar2,&local_5a0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subopt,
                      &local_5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f0," ",&local_5f1);
  pOVar3 = CLI::Option::option_text(pOVar3,&local_5f0);
  CLI::OptionBase<CLI::Option>::required(&pOVar3->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  pAVar2 = local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_618,"-l, --level",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_640,"encoding level",&local_641);
  pOVar3 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar2,&local_618,
                      (int *)((long)&app.config_formatter_.
                                     super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 4),&local_640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_668,"[1..9]",&local_669);
  pOVar3 = CLI::Option::option_text(pOVar3,&local_668);
  std::__cxx11::string::string((string *)&local_760);
  CLI::Range::Range<int>((Range *)&local_740,1,9,&local_760);
  CLI::Validator::Validator(&local_6d8,&local_740);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_780,"",&local_781);
  pOVar3 = CLI::Option::check(pOVar3,&local_6d8,&local_780);
  local_788 = 5;
  CLI::Option::default_val<int>(pOVar3,&local_788);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  CLI::Validator::~Validator(&local_6d8);
  CLI::Range::~Range((Range *)&local_740);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  pAVar2 = local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a8,"-R, --remove",&local_7a9);
  CLI::App::add_flag<const_char[18],_(CLI::detail::enabler)0>
            (pAVar2,&local_7a8,(char (*) [18])"remove input file");
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  pAVar2 = local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7d0,"-s, --suboption",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7f8,"suboption",&local_7f9);
  pOVar3 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>
                     (pAVar2,&local_7d0,
                      (int *)&app.config_formatter_.
                              super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,&local_7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_820," ",(allocator *)((long)&decode + 7));
  CLI::Option::option_text(pOVar3,&local_820);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator((allocator<char> *)((long)&decode + 7));
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_850,"d",&local_851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_878,"decode",&local_879);
  pAVar2 = CLI::App::add_subcommand((App *)local_3c0,&local_850,&local_878);
  pAVar2 = CLI::App::ignore_case(pAVar2,true);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  local_830 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8a0,"input",&local_8a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8c8,"input file",&local_8c9);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar2,&local_8a0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&output_file_name.field_2 + 8),&local_8c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8f0," ",&local_8f1);
  pOVar3 = CLI::Option::option_text(pOVar3,&local_8f0);
  pOVar3 = CLI::OptionBase<CLI::Option>::required(&pOVar3->super_OptionBase<CLI::Option>,true);
  CLI::Validator::Validator(&local_960,(Validator *)CLI::ExistingFile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_980,"",&local_981);
  CLI::Option::check(pOVar3,&local_960,&local_980);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  CLI::Validator::~Validator(&local_960);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  pAVar2 = local_830;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9a8,"output",&local_9a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9d0,"output file",&local_9d1);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar2,&local_9a8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subopt,
                      &local_9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9f8," ",(allocator *)(usage_msg.field_2._M_local_buf + 0xf));
  pOVar3 = CLI::Option::option_text(pOVar3,&local_9f8);
  CLI::OptionBase<CLI::Option>::required(&pOVar3->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::allocator<char>::~allocator((allocator<char> *)(usage_msg.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_9d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
  pcVar1 = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a60,pcVar1,&local_a61);
  std::operator+(&local_a40,"Usage: ",&local_a60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a20,
                 &local_a40," <command> [options] <input-file> <output-file>");
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::__cxx11::string::string((string *)&local_a88,(string *)local_a20);
  CLI::App::usage((App *)local_3c0,&local_a88);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_aa8,"",&local_aa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ad0,"",&local_ad1);
  CLI::App::set_help_flag((App *)local_3c0,&local_aa8,&local_ad0);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_af8,"-h, --help",&local_af9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b20,"",(allocator *)((long)&e + 7));
  CLI::App::set_help_all_flag((App *)local_3c0,&local_af8,&local_b20);
  std::__cxx11::string::~string((string *)&local_b20);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator((allocator<char> *)&local_af9);
  CLI::App::parse((App *)local_3c0,argc,argv);
  std::__cxx11::string::~string((string *)local_a20);
  CLI::App::~App((App *)local_3c0);
  std::__cxx11::string::~string((string *)&subopt);
  std::__cxx11::string::~string((string *)(output_file_name.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    std::string input_file_name, output_file_name;
    int level{5}, subopt{0};

    // app caption
    CLI::App app{"CLI11 help"};

    app.require_subcommand(1);
    // subcommands options and flags
    CLI::App *const encode = app.add_subcommand("e", "encode")->ignore_case();  // ignore case
    encode->add_option("input", input_file_name, "input file")
        ->option_text(" ")
        ->required()
        ->check(CLI::ExistingFile);                                                               // file must exist
    encode->add_option("output", output_file_name, "output file")->option_text(" ")->required();  // required option
    encode->add_option("-l, --level", level, "encoding level")
        ->option_text("[1..9]")
        ->check(CLI::Range(1, 9))
        ->default_val(5);                                   // limit parameter range
    encode->add_flag("-R, --remove", "remove input file");  // no parameter option
    encode->add_flag("-s, --suboption", subopt, "suboption")->option_text(" ");

    CLI::App *const decode = app.add_subcommand("d", "decode")->ignore_case();
    decode->add_option("input", input_file_name, "input file")->option_text(" ")->required()->check(CLI::ExistingFile);
    decode->add_option("output", output_file_name, "output file")->option_text(" ")->required();

    // Usage message modification
    std::string usage_msg = "Usage: " + std::string(argv[0]) + " <command> [options] <input-file> <output-file>";
    app.usage(usage_msg);
    // flag to display full help at once
    app.set_help_flag("");
    app.set_help_all_flag("-h, --help");

    CLI11_PARSE(app, argc, argv);

    return 0;
}